

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setBlend(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,bool enable)

{
  byte bVar1;
  byte in_SIL;
  long in_RDI;
  GLuint i;
  uint local_10;
  
  bVar1 = in_SIL & 1;
  if (((**(byte **)(in_RDI + 0x78) & 1) != bVar1) || ((*(byte *)(in_RDI + 0x82) & 1) != 0)) {
    if (bVar1 == 0) {
      (*GL.Disable)(0xbe2);
    }
    else {
      (*GL.Enable)(0xbe2);
    }
    for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0x48); local_10 = local_10 + 1) {
      *(byte *)(*(long *)(in_RDI + 0x78) + (ulong)local_10) = bVar1;
    }
    *(undefined1 *)(in_RDI + 0x82) = 0;
  }
  return;
}

Assistant:

void setBlend(bool enable)
	{
		if (Blend[0] != enable || BlendInvalid) {
			if (enable)
				GL.Enable(GL_BLEND);
			else
				GL.Disable(GL_BLEND);

			for (GLuint i = 0; i < FrameBufferCount; ++i)
				Blend[i] = enable;

			BlendInvalid = false;
		}
	}